

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreeVerifyConnections(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vBoxes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar5;
  int local_3c;
  int Box;
  int n;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vCounts;
  Vec_Wec_t *vBoxes_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStartFull(iVar1);
  for (n = 0; iVar1 = Vec_WecSize(vBoxes), n < iVar1; n = n + 1) {
    pVVar5 = Vec_WecEntry(vBoxes,n);
    for (Box = 0; iVar1 = Vec_IntSize(pVVar5), Box < iVar1; Box = Box + 1) {
      iVar1 = Vec_IntEntry(pVVar5,Box);
      iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
      Vec_IntWriteEntry(p_00,iVar2,0);
      iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
      Vec_IntWriteEntry(p_00,iVar1,0);
    }
  }
  for (n = 0; iVar1 = Vec_WecSize(vBoxes), n < iVar1; n = n + 1) {
    pVVar5 = Vec_WecEntry(vBoxes,n);
    for (Box = 0; iVar1 = Vec_IntSize(pVVar5), Box < iVar1; Box = Box + 1) {
      iVar1 = Vec_IntEntry(pVVar5,Box);
      for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + local_3c);
        iVar2 = Vec_IntEntry(p_00,iVar2);
        if (iVar2 != -1) {
          iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + local_3c);
          Vec_IntAddToEntry(p_00,iVar2,1);
        }
      }
    }
  }
  uVar3 = Vec_IntCountLarger(p_00,-1);
  printf("The adder tree has %d internal cut points. ",(ulong)uVar3);
  iVar1 = Vec_IntCountLarger(p_00,1);
  if (iVar1 == 0) {
    printf("There is no internal fanouts.\n");
  }
  else {
    uVar3 = Vec_IntCountLarger(p_00,1);
    printf("These %d points have more than one fanout:\n",(ulong)uVar3);
    for (n = 0; iVar1 = Vec_IntSize(p_00), n < iVar1; n = n + 1) {
      uVar3 = Vec_IntEntry(p_00,n);
      if (1 < (int)uVar3) {
        uVar4 = Gia_ObjLevelId(p,n);
        printf("Node %d(lev %d) has fanout %d.\n",(ulong)(uint)n,(ulong)uVar4,(ulong)uVar3);
      }
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Acec_TreeVerifyConnections( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes )
{
    Vec_Int_t * vCounts = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, n, Box;
    // mark outputs
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
        {
            Vec_IntWriteEntry( vCounts, Vec_IntEntry( vAdds, 6*Box+3 ), 0 );
            Vec_IntWriteEntry( vCounts, Vec_IntEntry( vAdds, 6*Box+4 ), 0 );
        }
    // count fanouts
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            for ( n = 0; n < 3; n++ )
                if ( Vec_IntEntry( vCounts, Vec_IntEntry(vAdds, 6*Box+n) ) != -1 )
                    Vec_IntAddToEntry( vCounts, Vec_IntEntry(vAdds, 6*Box+n), 1 );
    // print out
    printf( "The adder tree has %d internal cut points. ", Vec_IntCountLarger(vCounts, -1) );
    if ( Vec_IntCountLarger(vCounts, 1) == 0 )
        printf( "There is no internal fanouts.\n" );
    else
    {
        printf( "These %d points have more than one fanout:\n", Vec_IntCountLarger(vCounts, 1) );
        Vec_IntForEachEntry( vCounts, Box, i )
            if ( Box > 1 )
                printf( "Node %d(lev %d) has fanout %d.\n", i, Gia_ObjLevelId(p, i), Box );
    }
    Vec_IntFree( vCounts );
}